

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LossLayer::LossLayer(LossLayer *this,LossLayer *from)

{
  void *pvVar1;
  ArenaStringPtr value;
  CategoricalCrossEntropyLossLayer *this_00;
  CategoricalCrossEntropyLossLayer *from_00;
  MeanSquaredErrorLossLayer *this_01;
  MeanSquaredErrorLossLayer *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LossLayer_0039b810;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  value.ptr_ = (from->name_).ptr_;
  if ((value.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0xb) {
    this_01 = mutable_meansquarederrorlosslayer(this);
    from_01 = meansquarederrorlosslayer(from);
    MeanSquaredErrorLossLayer::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 10) {
    this_00 = mutable_categoricalcrossentropylosslayer(this);
    from_00 = categoricalcrossentropylosslayer(from);
    CategoricalCrossEntropyLossLayer::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

LossLayer::LossLayer(const LossLayer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.name().size() > 0) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  clear_has_LossLayerType();
  switch (from.LossLayerType_case()) {
    case kCategoricalCrossEntropyLossLayer: {
      mutable_categoricalcrossentropylosslayer()->::CoreML::Specification::CategoricalCrossEntropyLossLayer::MergeFrom(from.categoricalcrossentropylosslayer());
      break;
    }
    case kMeanSquaredErrorLossLayer: {
      mutable_meansquarederrorlosslayer()->::CoreML::Specification::MeanSquaredErrorLossLayer::MergeFrom(from.meansquarederrorlosslayer());
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LossLayer)
}